

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O2

string * sago::getStateDir_abi_cxx11_(void)

{
  string *in_RDI;
  
  getLinuxFolderDefault_abi_cxx11_(in_RDI,"XDG_STATE_HOME",".local/state");
  return in_RDI;
}

Assistant:

std::string getStateDir() {
#ifdef _WIN32
	return GetAppDataLocal();
#elif defined(__APPLE__)
	return sago::internal::getHome()+"/Library/Application Support";
#else
	return getLinuxFolderDefault("XDG_STATE_HOME", ".local/state");
#endif
}